

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_1,_true,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::QuadMiIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  int iVar1;
  Scene *pSVar2;
  float **ppfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  Geometry *pGVar8;
  RTCFilterFunctionN p_Var9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  bool bVar61;
  bool bVar62;
  bool bVar63;
  bool bVar64;
  uint uVar65;
  ulong uVar66;
  long lVar67;
  long lVar68;
  ulong uVar69;
  ulong uVar70;
  ulong uVar71;
  ulong uVar72;
  ulong uVar73;
  undefined4 uVar74;
  ulong unaff_R14;
  size_t mask;
  ulong uVar75;
  bool bVar76;
  bool bVar77;
  undefined1 auVar78 [16];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [16];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [64];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [64];
  float fVar102;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [64];
  float fVar116;
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  undefined1 auVar120 [64];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [64];
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  undefined1 auVar132 [32];
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  undefined1 auVar138 [32];
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  undefined1 auVar151 [32];
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  RTCFilterFunctionNArguments args;
  NodeRef stack [564];
  ulong *local_18b8;
  undefined8 local_1870;
  undefined8 uStack_1868;
  undefined8 *local_1860;
  ulong local_1858;
  ulong local_1850;
  ulong *local_1848;
  undefined1 local_1840 [32];
  undefined1 local_1820 [32];
  RTCFilterFunctionNArguments local_17f0;
  float local_17c0;
  float fStack_17bc;
  float fStack_17b8;
  float fStack_17b4;
  float fStack_17b0;
  float fStack_17ac;
  float fStack_17a8;
  float fStack_17a4;
  float local_17a0;
  float fStack_179c;
  float fStack_1798;
  float fStack_1794;
  float fStack_1790;
  float fStack_178c;
  float fStack_1788;
  float fStack_1784;
  float local_1780;
  float fStack_177c;
  float fStack_1778;
  float fStack_1774;
  float fStack_1770;
  float fStack_176c;
  float fStack_1768;
  float fStack_1764;
  float local_1760;
  float fStack_175c;
  float fStack_1758;
  float fStack_1754;
  float fStack_1750;
  float fStack_174c;
  float fStack_1748;
  float fStack_1744;
  float local_1740;
  float fStack_173c;
  float fStack_1738;
  float fStack_1734;
  float fStack_1730;
  float fStack_172c;
  float fStack_1728;
  float fStack_1724;
  float local_1720;
  float fStack_171c;
  float fStack_1718;
  float fStack_1714;
  float fStack_1710;
  float fStack_170c;
  float fStack_1708;
  float fStack_1704;
  undefined1 local_1700 [32];
  undefined1 local_16e0 [32];
  undefined1 local_16c0 [32];
  undefined1 local_16a0 [32];
  undefined1 local_1680 [32];
  float local_1660;
  float fStack_165c;
  float fStack_1658;
  float fStack_1654;
  float fStack_1650;
  float fStack_164c;
  float fStack_1648;
  float fStack_1644;
  undefined4 local_1630;
  undefined4 uStack_162c;
  undefined4 uStack_1628;
  undefined4 uStack_1624;
  undefined1 local_1620 [16];
  undefined1 local_1610 [16];
  undefined1 local_1600 [16];
  undefined1 local_15f0 [16];
  undefined4 local_15e0;
  undefined4 uStack_15dc;
  undefined4 uStack_15d8;
  undefined4 uStack_15d4;
  undefined1 local_15d0 [16];
  uint local_15c0;
  uint uStack_15bc;
  uint uStack_15b8;
  uint uStack_15b4;
  uint uStack_15b0;
  uint uStack_15ac;
  uint uStack_15a8;
  uint uStack_15a4;
  undefined1 local_15a0 [8];
  float fStack_1598;
  float fStack_1594;
  float fStack_1590;
  float fStack_158c;
  float fStack_1588;
  undefined4 uStack_1584;
  undefined1 local_1580 [32];
  undefined1 local_1560 [32];
  undefined1 local_1540 [32];
  undefined1 local_1520 [32];
  undefined1 local_1500 [32];
  undefined1 local_14e0 [32];
  undefined1 local_14c0 [32];
  undefined1 local_14a0 [32];
  undefined1 local_1480 [32];
  undefined1 local_1460 [32];
  undefined1 local_1440 [32];
  undefined1 local_1420 [32];
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined8 local_13e0;
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  float local_13c0;
  float fStack_13bc;
  float fStack_13b8;
  float fStack_13b4;
  undefined4 uStack_13b0;
  undefined4 uStack_13ac;
  undefined4 uStack_13a8;
  undefined4 uStack_13a4;
  undefined1 local_13a0 [32];
  undefined1 local_1380 [32];
  undefined1 local_1360 [32];
  undefined1 local_1340 [32];
  undefined1 local_1320 [32];
  undefined1 local_1300 [32];
  undefined1 local_12e0 [32];
  undefined1 local_12c0 [32];
  undefined1 local_12a0 [32];
  float local_1280 [4];
  float fStack_1270;
  float fStack_126c;
  float fStack_1268;
  undefined4 uStack_1264;
  undefined1 local_1260 [32];
  float local_1240 [4];
  float fStack_1230;
  float fStack_122c;
  float fStack_1228;
  undefined4 uStack_1224;
  undefined1 local_1220 [32];
  size_t local_1200;
  ulong local_11f8 [569];
  
  local_18b8 = local_11f8;
  local_1200 = root.ptr;
  uVar74 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_16c0._4_4_ = uVar74;
  local_16c0._0_4_ = uVar74;
  local_16c0._8_4_ = uVar74;
  local_16c0._12_4_ = uVar74;
  local_16c0._16_4_ = uVar74;
  local_16c0._20_4_ = uVar74;
  local_16c0._24_4_ = uVar74;
  local_16c0._28_4_ = uVar74;
  auVar115 = ZEXT3264(local_16c0);
  uVar74 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_16e0._4_4_ = uVar74;
  local_16e0._0_4_ = uVar74;
  local_16e0._8_4_ = uVar74;
  local_16e0._12_4_ = uVar74;
  local_16e0._16_4_ = uVar74;
  local_16e0._20_4_ = uVar74;
  local_16e0._24_4_ = uVar74;
  local_16e0._28_4_ = uVar74;
  auVar120 = ZEXT3264(local_16e0);
  uVar74 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_1700._4_4_ = uVar74;
  local_1700._0_4_ = uVar74;
  local_1700._8_4_ = uVar74;
  local_1700._12_4_ = uVar74;
  local_1700._16_4_ = uVar74;
  local_1700._20_4_ = uVar74;
  local_1700._24_4_ = uVar74;
  local_1700._28_4_ = uVar74;
  auVar131 = ZEXT3264(local_1700);
  fVar116 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar121 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar122 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar123 = fVar116 * 0.99999964;
  fVar124 = fVar121 * 0.99999964;
  fVar125 = fVar122 * 0.99999964;
  fVar116 = fVar116 * 1.0000004;
  fVar121 = fVar121 * 1.0000004;
  fVar122 = fVar122 * 1.0000004;
  uVar72 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar75 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar73 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar1 = (tray->tnear).field_0.i[k];
  local_1680._4_4_ = iVar1;
  local_1680._0_4_ = iVar1;
  local_1680._8_4_ = iVar1;
  local_1680._12_4_ = iVar1;
  local_1680._16_4_ = iVar1;
  local_1680._20_4_ = iVar1;
  local_1680._24_4_ = iVar1;
  local_1680._28_4_ = iVar1;
  auVar96 = ZEXT3264(local_1680);
  iVar1 = (tray->tfar).field_0.i[k];
  local_16a0._4_4_ = iVar1;
  local_16a0._0_4_ = iVar1;
  local_16a0._8_4_ = iVar1;
  local_16a0._12_4_ = iVar1;
  local_16a0._16_4_ = iVar1;
  local_16a0._20_4_ = iVar1;
  local_16a0._24_4_ = iVar1;
  local_16a0._28_4_ = iVar1;
  auVar101 = ZEXT3264(local_16a0);
  local_1580._16_16_ = mm_lookupmask_ps._240_16_;
  local_1580._0_16_ = mm_lookupmask_ps._0_16_;
  local_1860 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  auVar87._8_4_ = 0x3f800000;
  auVar87._0_8_ = &DAT_3f8000003f800000;
  auVar87._12_4_ = 0x3f800000;
  auVar87._16_4_ = 0x3f800000;
  auVar87._20_4_ = 0x3f800000;
  auVar87._24_4_ = 0x3f800000;
  auVar87._28_4_ = 0x3f800000;
  auVar79._8_4_ = 0xbf800000;
  auVar79._0_8_ = 0xbf800000bf800000;
  auVar79._12_4_ = 0xbf800000;
  auVar79._16_4_ = 0xbf800000;
  auVar79._20_4_ = 0xbf800000;
  auVar79._24_4_ = 0xbf800000;
  auVar79._28_4_ = 0xbf800000;
  _local_15a0 = vblendvps_avx(auVar87,auVar79,local_1580);
  fVar126 = fVar123;
  fVar133 = fVar123;
  fVar134 = fVar123;
  fVar135 = fVar123;
  fVar136 = fVar123;
  fVar137 = fVar123;
  fVar139 = fVar124;
  fVar140 = fVar124;
  fVar141 = fVar124;
  fVar142 = fVar124;
  fVar143 = fVar124;
  fVar144 = fVar124;
  fVar145 = fVar125;
  fVar146 = fVar125;
  fVar147 = fVar125;
  fVar148 = fVar125;
  fVar149 = fVar125;
  fVar150 = fVar125;
  fVar152 = fVar116;
  fVar153 = fVar116;
  fVar154 = fVar116;
  fVar155 = fVar116;
  fVar156 = fVar116;
  fVar157 = fVar116;
  fVar158 = fVar121;
  fVar159 = fVar121;
  fVar160 = fVar121;
  fVar161 = fVar121;
  fVar162 = fVar121;
  fVar163 = fVar121;
  fVar164 = fVar122;
  fVar165 = fVar122;
  fVar166 = fVar122;
  fVar167 = fVar122;
  fVar168 = fVar122;
  fVar169 = fVar122;
  local_17c0 = fVar122;
  fStack_17bc = fVar122;
  fStack_17b8 = fVar122;
  fStack_17b4 = fVar122;
  fStack_17b0 = fVar122;
  fStack_17ac = fVar122;
  fStack_17a8 = fVar122;
  fStack_17a4 = fVar122;
  local_17a0 = fVar121;
  fStack_179c = fVar121;
  fStack_1798 = fVar121;
  fStack_1794 = fVar121;
  fStack_1790 = fVar121;
  fStack_178c = fVar121;
  fStack_1788 = fVar121;
  fStack_1784 = fVar121;
  local_1780 = fVar116;
  fStack_177c = fVar116;
  fStack_1778 = fVar116;
  fStack_1774 = fVar116;
  fStack_1770 = fVar116;
  fStack_176c = fVar116;
  fStack_1768 = fVar116;
  fStack_1764 = fVar116;
  local_1760 = fVar125;
  fStack_175c = fVar125;
  fStack_1758 = fVar125;
  fStack_1754 = fVar125;
  fStack_1750 = fVar125;
  fStack_174c = fVar125;
  fStack_1748 = fVar125;
  fStack_1744 = fVar125;
  local_1740 = fVar124;
  fStack_173c = fVar124;
  fStack_1738 = fVar124;
  fStack_1734 = fVar124;
  fStack_1730 = fVar124;
  fStack_172c = fVar124;
  fStack_1728 = fVar124;
  fStack_1724 = fVar124;
  local_1720 = fVar123;
  fStack_171c = fVar123;
  fStack_1718 = fVar123;
  fStack_1714 = fVar123;
  fStack_1710 = fVar123;
  fStack_170c = fVar123;
  fStack_1708 = fVar123;
  fStack_1704 = fVar123;
  do {
    local_1848 = local_18b8;
    if (local_18b8 == &local_1200) break;
    uVar71 = local_18b8[-1];
    local_18b8 = local_18b8 + -1;
    do {
      if ((uVar71 & 8) == 0) {
        auVar79 = vsubps_avx(*(undefined1 (*) [32])(uVar71 + 0x40 + uVar72),auVar115._0_32_);
        auVar85._4_4_ = fVar126 * auVar79._4_4_;
        auVar85._0_4_ = fVar123 * auVar79._0_4_;
        auVar85._8_4_ = fVar133 * auVar79._8_4_;
        auVar85._12_4_ = fVar134 * auVar79._12_4_;
        auVar85._16_4_ = fVar135 * auVar79._16_4_;
        auVar85._20_4_ = fVar136 * auVar79._20_4_;
        auVar85._24_4_ = fVar137 * auVar79._24_4_;
        auVar85._28_4_ = auVar79._28_4_;
        auVar79 = vsubps_avx(*(undefined1 (*) [32])(uVar71 + 0x40 + uVar75),auVar120._0_32_);
        auVar40._4_4_ = fVar139 * auVar79._4_4_;
        auVar40._0_4_ = fVar124 * auVar79._0_4_;
        auVar40._8_4_ = fVar140 * auVar79._8_4_;
        auVar40._12_4_ = fVar141 * auVar79._12_4_;
        auVar40._16_4_ = fVar142 * auVar79._16_4_;
        auVar40._20_4_ = fVar143 * auVar79._20_4_;
        auVar40._24_4_ = fVar144 * auVar79._24_4_;
        auVar40._28_4_ = auVar79._28_4_;
        auVar79 = vmaxps_avx(auVar85,auVar40);
        auVar87 = vsubps_avx(*(undefined1 (*) [32])(uVar71 + 0x40 + uVar73),auVar131._0_32_);
        auVar31._4_4_ = fVar145 * auVar87._4_4_;
        auVar31._0_4_ = fVar125 * auVar87._0_4_;
        auVar31._8_4_ = fVar146 * auVar87._8_4_;
        auVar31._12_4_ = fVar147 * auVar87._12_4_;
        auVar31._16_4_ = fVar148 * auVar87._16_4_;
        auVar31._20_4_ = fVar149 * auVar87._20_4_;
        auVar31._24_4_ = fVar150 * auVar87._24_4_;
        auVar31._28_4_ = auVar87._28_4_;
        auVar87 = vmaxps_avx(auVar31,auVar96._0_32_);
        auVar79 = vmaxps_avx(auVar79,auVar87);
        auVar87 = vsubps_avx(*(undefined1 (*) [32])(uVar71 + 0x40 + (uVar72 ^ 0x20)),auVar115._0_32_
                            );
        auVar32._4_4_ = fVar152 * auVar87._4_4_;
        auVar32._0_4_ = fVar116 * auVar87._0_4_;
        auVar32._8_4_ = fVar153 * auVar87._8_4_;
        auVar32._12_4_ = fVar154 * auVar87._12_4_;
        auVar32._16_4_ = fVar155 * auVar87._16_4_;
        auVar32._20_4_ = fVar156 * auVar87._20_4_;
        auVar32._24_4_ = fVar157 * auVar87._24_4_;
        auVar32._28_4_ = auVar87._28_4_;
        auVar87 = vsubps_avx(*(undefined1 (*) [32])(uVar71 + 0x40 + (uVar75 ^ 0x20)),auVar120._0_32_
                            );
        auVar33._4_4_ = fVar158 * auVar87._4_4_;
        auVar33._0_4_ = fVar121 * auVar87._0_4_;
        auVar33._8_4_ = fVar159 * auVar87._8_4_;
        auVar33._12_4_ = fVar160 * auVar87._12_4_;
        auVar33._16_4_ = fVar161 * auVar87._16_4_;
        auVar33._20_4_ = fVar162 * auVar87._20_4_;
        auVar33._24_4_ = fVar163 * auVar87._24_4_;
        auVar33._28_4_ = auVar87._28_4_;
        auVar87 = vminps_avx(auVar32,auVar33);
        auVar85 = vsubps_avx(*(undefined1 (*) [32])(uVar71 + 0x40 + (uVar73 ^ 0x20)),auVar131._0_32_
                            );
        auVar41._4_4_ = fVar164 * auVar85._4_4_;
        auVar41._0_4_ = fVar122 * auVar85._0_4_;
        auVar41._8_4_ = fVar165 * auVar85._8_4_;
        auVar41._12_4_ = fVar166 * auVar85._12_4_;
        auVar41._16_4_ = fVar167 * auVar85._16_4_;
        auVar41._20_4_ = fVar168 * auVar85._20_4_;
        auVar41._24_4_ = fVar169 * auVar85._24_4_;
        auVar41._28_4_ = auVar85._28_4_;
        auVar85 = vminps_avx(auVar41,auVar101._0_32_);
        auVar87 = vminps_avx(auVar87,auVar85);
        auVar79 = vcmpps_avx(auVar79,auVar87,2);
        uVar74 = vmovmskps_avx(auVar79);
        unaff_R14 = CONCAT44((int)(unaff_R14 >> 0x20),uVar74);
      }
      if ((uVar71 & 8) == 0) {
        if (unaff_R14 == 0) {
          uVar65 = 4;
        }
        else {
          uVar70 = uVar71 & 0xfffffffffffffff0;
          lVar68 = 0;
          for (uVar71 = unaff_R14; (uVar71 & 1) == 0; uVar71 = uVar71 >> 1 | 0x8000000000000000) {
            lVar68 = lVar68 + 1;
          }
          for (uVar66 = unaff_R14 - 1 & unaff_R14; uVar71 = *(ulong *)(uVar70 + lVar68 * 8),
              uVar66 != 0; uVar66 = uVar66 - 1 & uVar66) {
            *local_18b8 = uVar71;
            local_18b8 = local_18b8 + 1;
            lVar68 = 0;
            for (uVar71 = uVar66; (uVar71 & 1) == 0; uVar71 = uVar71 >> 1 | 0x8000000000000000) {
              lVar68 = lVar68 + 1;
            }
          }
          uVar65 = 0;
        }
      }
      else {
        uVar65 = 6;
      }
    } while (uVar65 == 0);
    if (uVar65 == 6) {
      uVar65 = 0;
      local_1858 = (ulong)((uint)uVar71 & 0xf) - 8;
      bVar76 = local_1858 != 0;
      if (bVar76) {
        uVar71 = uVar71 & 0xfffffffffffffff0;
        local_1850 = 0;
        do {
          lVar67 = local_1850 * 0x60;
          pSVar2 = context->scene;
          ppfVar3 = (pSVar2->vertices).items;
          pfVar4 = ppfVar3[*(uint *)(uVar71 + 0x40 + lVar67)];
          auVar88._16_16_ = *(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar71 + 0x20 + lVar67));
          auVar88._0_16_ = *(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar71 + lVar67));
          pfVar5 = ppfVar3[*(uint *)(uVar71 + 0x48 + lVar67)];
          auVar92._16_16_ = *(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar71 + 0x28 + lVar67));
          auVar92._0_16_ = *(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar71 + 8 + lVar67));
          pfVar6 = ppfVar3[*(uint *)(uVar71 + 0x44 + lVar67)];
          auVar103._16_16_ = *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar71 + 0x24 + lVar67));
          auVar103._0_16_ = *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar71 + 4 + lVar67));
          pfVar7 = ppfVar3[*(uint *)(uVar71 + 0x4c + lVar67)];
          auVar127._16_16_ = *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar71 + 0x2c + lVar67));
          auVar127._0_16_ = *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar71 + 0xc + lVar67));
          lVar68 = uVar71 + 0x40 + lVar67;
          local_13e0 = *(undefined8 *)(lVar68 + 0x10);
          uStack_13d8 = *(undefined8 *)(lVar68 + 0x18);
          uStack_13d0 = local_13e0;
          uStack_13c8 = uStack_13d8;
          lVar68 = uVar71 + 0x50 + lVar67;
          local_1400 = *(undefined8 *)(lVar68 + 0x10);
          uStack_13f8 = *(undefined8 *)(lVar68 + 0x18);
          auVar86 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar71 + 0x10 + lVar67))
                                  ,*(undefined1 (*) [16])
                                    (pfVar5 + *(uint *)(uVar71 + 0x18 + lVar67)));
          auVar78 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar71 + 0x10 + lVar67))
                                  ,*(undefined1 (*) [16])
                                    (pfVar5 + *(uint *)(uVar71 + 0x18 + lVar67)));
          auVar35 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar71 + 0x14 + lVar67))
                                  ,*(undefined1 (*) [16])
                                    (pfVar7 + *(uint *)(uVar71 + 0x1c + lVar67)));
          auVar34 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar71 + 0x14 + lVar67))
                                  ,*(undefined1 (*) [16])
                                    (pfVar7 + *(uint *)(uVar71 + 0x1c + lVar67)));
          auVar36 = vunpcklps_avx(auVar78,auVar34);
          auVar37 = vunpcklps_avx(auVar86,auVar35);
          auVar78 = vunpckhps_avx(auVar86,auVar35);
          auVar35 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar71 + 0x30 + lVar67))
                                  ,*(undefined1 (*) [16])
                                    (pfVar5 + *(uint *)(uVar71 + 0x38 + lVar67)));
          auVar34 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar71 + 0x30 + lVar67))
                                  ,*(undefined1 (*) [16])
                                    (pfVar5 + *(uint *)(uVar71 + 0x38 + lVar67)));
          auVar38 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar71 + 0x34 + lVar67))
                                  ,*(undefined1 (*) [16])
                                    (pfVar7 + *(uint *)(uVar71 + 0x3c + lVar67)));
          auVar86 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar71 + 0x34 + lVar67))
                                  ,*(undefined1 (*) [16])
                                    (pfVar7 + *(uint *)(uVar71 + 0x3c + lVar67)));
          auVar86 = vunpcklps_avx(auVar34,auVar86);
          auVar39 = vunpcklps_avx(auVar35,auVar38);
          auVar34 = vunpckhps_avx(auVar35,auVar38);
          uStack_13f0 = local_1400;
          uStack_13e8 = uStack_13f8;
          auVar79 = vunpcklps_avx(auVar103,auVar127);
          auVar87 = vunpcklps_avx(auVar88,auVar92);
          auVar40 = vunpcklps_avx(auVar87,auVar79);
          auVar79 = vunpckhps_avx(auVar87,auVar79);
          auVar87 = vunpckhps_avx(auVar103,auVar127);
          auVar85 = vunpckhps_avx(auVar88,auVar92);
          auVar87 = vunpcklps_avx(auVar85,auVar87);
          auVar93._16_16_ = auVar37;
          auVar93._0_16_ = auVar37;
          auVar104._16_16_ = auVar78;
          auVar104._0_16_ = auVar78;
          auVar114._16_16_ = auVar36;
          auVar114._0_16_ = auVar36;
          auVar151._16_16_ = auVar39;
          auVar151._0_16_ = auVar39;
          auVar97._16_16_ = auVar34;
          auVar97._0_16_ = auVar34;
          uVar74 = *(undefined4 *)(ray + k * 4);
          auVar117._4_4_ = uVar74;
          auVar117._0_4_ = uVar74;
          auVar117._8_4_ = uVar74;
          auVar117._12_4_ = uVar74;
          auVar117._16_4_ = uVar74;
          auVar117._20_4_ = uVar74;
          auVar117._24_4_ = uVar74;
          auVar117._28_4_ = uVar74;
          uVar74 = *(undefined4 *)(ray + k * 4 + 0x10);
          auVar128._4_4_ = uVar74;
          auVar128._0_4_ = uVar74;
          auVar128._8_4_ = uVar74;
          auVar128._12_4_ = uVar74;
          auVar128._16_4_ = uVar74;
          auVar128._20_4_ = uVar74;
          auVar128._24_4_ = uVar74;
          auVar128._28_4_ = uVar74;
          auVar80._16_16_ = auVar86;
          auVar80._0_16_ = auVar86;
          uVar74 = *(undefined4 *)(ray + k * 4 + 0x20);
          auVar138._4_4_ = uVar74;
          auVar138._0_4_ = uVar74;
          auVar138._8_4_ = uVar74;
          auVar138._12_4_ = uVar74;
          auVar138._16_4_ = uVar74;
          auVar138._20_4_ = uVar74;
          auVar138._24_4_ = uVar74;
          auVar138._28_4_ = uVar74;
          local_1420 = vsubps_avx(auVar40,auVar117);
          local_1440 = vsubps_avx(auVar79,auVar128);
          local_1460 = vsubps_avx(auVar87,auVar138);
          auVar79 = vsubps_avx(auVar93,auVar117);
          auVar87 = vsubps_avx(auVar104,auVar128);
          auVar85 = vsubps_avx(auVar114,auVar138);
          auVar40 = vsubps_avx(auVar151,auVar117);
          auVar31 = vsubps_avx(auVar97,auVar128);
          auVar32 = vsubps_avx(auVar80,auVar138);
          local_1480 = vsubps_avx(auVar40,local_1420);
          local_14c0 = vsubps_avx(auVar31,local_1440);
          local_14a0 = vsubps_avx(auVar32,local_1460);
          auVar81._0_4_ = auVar40._0_4_ + local_1420._0_4_;
          auVar81._4_4_ = auVar40._4_4_ + local_1420._4_4_;
          auVar81._8_4_ = auVar40._8_4_ + local_1420._8_4_;
          auVar81._12_4_ = auVar40._12_4_ + local_1420._12_4_;
          auVar81._16_4_ = auVar40._16_4_ + local_1420._16_4_;
          auVar81._20_4_ = auVar40._20_4_ + local_1420._20_4_;
          auVar81._24_4_ = auVar40._24_4_ + local_1420._24_4_;
          auVar81._28_4_ = auVar40._28_4_ + local_1420._28_4_;
          auVar94._0_4_ = auVar31._0_4_ + local_1440._0_4_;
          auVar94._4_4_ = auVar31._4_4_ + local_1440._4_4_;
          auVar94._8_4_ = auVar31._8_4_ + local_1440._8_4_;
          auVar94._12_4_ = auVar31._12_4_ + local_1440._12_4_;
          auVar94._16_4_ = auVar31._16_4_ + local_1440._16_4_;
          auVar94._20_4_ = auVar31._20_4_ + local_1440._20_4_;
          auVar94._24_4_ = auVar31._24_4_ + local_1440._24_4_;
          fVar116 = local_1440._28_4_;
          auVar94._28_4_ = auVar31._28_4_ + fVar116;
          fVar10 = local_1460._0_4_;
          auVar98._0_4_ = auVar32._0_4_ + fVar10;
          fVar11 = local_1460._4_4_;
          auVar98._4_4_ = auVar32._4_4_ + fVar11;
          fVar12 = local_1460._8_4_;
          auVar98._8_4_ = auVar32._8_4_ + fVar12;
          fVar13 = local_1460._12_4_;
          auVar98._12_4_ = auVar32._12_4_ + fVar13;
          fVar14 = local_1460._16_4_;
          auVar98._16_4_ = auVar32._16_4_ + fVar14;
          fVar15 = local_1460._20_4_;
          auVar98._20_4_ = auVar32._20_4_ + fVar15;
          fVar16 = local_1460._24_4_;
          auVar98._24_4_ = auVar32._24_4_ + fVar16;
          auVar98._28_4_ = auVar32._28_4_ + local_1460._28_4_;
          auVar42._4_4_ = local_14a0._4_4_ * auVar94._4_4_;
          auVar42._0_4_ = local_14a0._0_4_ * auVar94._0_4_;
          auVar42._8_4_ = local_14a0._8_4_ * auVar94._8_4_;
          auVar42._12_4_ = local_14a0._12_4_ * auVar94._12_4_;
          auVar42._16_4_ = local_14a0._16_4_ * auVar94._16_4_;
          auVar42._20_4_ = local_14a0._20_4_ * auVar94._20_4_;
          auVar42._24_4_ = local_14a0._24_4_ * auVar94._24_4_;
          auVar42._28_4_ = auVar39._12_4_;
          auVar34 = vfmsub231ps_fma(auVar42,local_14c0,auVar98);
          auVar43._4_4_ = local_1480._4_4_ * auVar98._4_4_;
          auVar43._0_4_ = local_1480._0_4_ * auVar98._0_4_;
          auVar43._8_4_ = local_1480._8_4_ * auVar98._8_4_;
          auVar43._12_4_ = local_1480._12_4_ * auVar98._12_4_;
          auVar43._16_4_ = local_1480._16_4_ * auVar98._16_4_;
          auVar43._20_4_ = local_1480._20_4_ * auVar98._20_4_;
          auVar43._24_4_ = local_1480._24_4_ * auVar98._24_4_;
          auVar43._28_4_ = auVar98._28_4_;
          auVar78 = vfmsub231ps_fma(auVar43,local_14a0,auVar81);
          auVar44._4_4_ = auVar81._4_4_ * local_14c0._4_4_;
          auVar44._0_4_ = auVar81._0_4_ * local_14c0._0_4_;
          auVar44._8_4_ = auVar81._8_4_ * local_14c0._8_4_;
          auVar44._12_4_ = auVar81._12_4_ * local_14c0._12_4_;
          auVar44._16_4_ = auVar81._16_4_ * local_14c0._16_4_;
          auVar44._20_4_ = auVar81._20_4_ * local_14c0._20_4_;
          auVar44._24_4_ = auVar81._24_4_ * local_14c0._24_4_;
          auVar44._28_4_ = auVar81._28_4_;
          auVar86 = vfmsub231ps_fma(auVar44,local_1480,auVar94);
          uVar74 = *(undefined4 *)(ray + k * 4 + 0x50);
          local_1820._4_4_ = uVar74;
          local_1820._0_4_ = uVar74;
          local_1820._8_4_ = uVar74;
          local_1820._12_4_ = uVar74;
          local_1820._16_4_ = uVar74;
          local_1820._20_4_ = uVar74;
          local_1820._24_4_ = uVar74;
          local_1820._28_4_ = uVar74;
          fStack_165c = *(float *)(ray + k * 4 + 0x60);
          auVar45._4_4_ = fStack_165c * auVar86._4_4_;
          auVar45._0_4_ = fStack_165c * auVar86._0_4_;
          auVar45._8_4_ = fStack_165c * auVar86._8_4_;
          auVar45._12_4_ = fStack_165c * auVar86._12_4_;
          auVar45._16_4_ = fStack_165c * 0.0;
          auVar45._20_4_ = fStack_165c * 0.0;
          auVar45._24_4_ = fStack_165c * 0.0;
          auVar45._28_4_ = local_14a0._28_4_;
          auVar78 = vfmadd231ps_fma(auVar45,local_1820,ZEXT1632(auVar78));
          uVar74 = *(undefined4 *)(ray + k * 4 + 0x40);
          local_1840._4_4_ = uVar74;
          local_1840._0_4_ = uVar74;
          local_1840._8_4_ = uVar74;
          local_1840._12_4_ = uVar74;
          local_1840._16_4_ = uVar74;
          local_1840._20_4_ = uVar74;
          local_1840._24_4_ = uVar74;
          local_1840._28_4_ = uVar74;
          auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),local_1840,ZEXT1632(auVar34));
          local_14e0 = vsubps_avx(local_1440,auVar87);
          local_1520 = vsubps_avx(local_1460,auVar85);
          auVar95._0_4_ = local_1440._0_4_ + auVar87._0_4_;
          auVar95._4_4_ = local_1440._4_4_ + auVar87._4_4_;
          auVar95._8_4_ = local_1440._8_4_ + auVar87._8_4_;
          auVar95._12_4_ = local_1440._12_4_ + auVar87._12_4_;
          auVar95._16_4_ = local_1440._16_4_ + auVar87._16_4_;
          auVar95._20_4_ = local_1440._20_4_ + auVar87._20_4_;
          auVar95._24_4_ = local_1440._24_4_ + auVar87._24_4_;
          auVar95._28_4_ = fVar116 + auVar87._28_4_;
          auVar99._0_4_ = auVar85._0_4_ + fVar10;
          auVar99._4_4_ = auVar85._4_4_ + fVar11;
          auVar99._8_4_ = auVar85._8_4_ + fVar12;
          auVar99._12_4_ = auVar85._12_4_ + fVar13;
          auVar99._16_4_ = auVar85._16_4_ + fVar14;
          auVar99._20_4_ = auVar85._20_4_ + fVar15;
          auVar99._24_4_ = auVar85._24_4_ + fVar16;
          auVar99._28_4_ = auVar85._28_4_ + local_1460._28_4_;
          fVar102 = local_1520._0_4_;
          fVar108 = local_1520._4_4_;
          auVar46._4_4_ = auVar95._4_4_ * fVar108;
          auVar46._0_4_ = auVar95._0_4_ * fVar102;
          fVar111 = local_1520._8_4_;
          auVar46._8_4_ = auVar95._8_4_ * fVar111;
          fVar19 = local_1520._12_4_;
          auVar46._12_4_ = auVar95._12_4_ * fVar19;
          fVar22 = local_1520._16_4_;
          auVar46._16_4_ = auVar95._16_4_ * fVar22;
          fVar25 = local_1520._20_4_;
          auVar46._20_4_ = auVar95._20_4_ * fVar25;
          fVar28 = local_1520._24_4_;
          auVar46._24_4_ = auVar95._24_4_ * fVar28;
          auVar46._28_4_ = fVar116;
          auVar86 = vfmsub231ps_fma(auVar46,local_14e0,auVar99);
          local_1500 = vsubps_avx(local_1420,auVar79);
          fVar106 = local_1500._0_4_;
          fVar109 = local_1500._4_4_;
          auVar47._4_4_ = auVar99._4_4_ * fVar109;
          auVar47._0_4_ = auVar99._0_4_ * fVar106;
          fVar17 = local_1500._8_4_;
          auVar47._8_4_ = auVar99._8_4_ * fVar17;
          fVar20 = local_1500._12_4_;
          auVar47._12_4_ = auVar99._12_4_ * fVar20;
          fVar23 = local_1500._16_4_;
          auVar47._16_4_ = auVar99._16_4_ * fVar23;
          fVar26 = local_1500._20_4_;
          auVar47._20_4_ = auVar99._20_4_ * fVar26;
          fVar29 = local_1500._24_4_;
          auVar47._24_4_ = auVar99._24_4_ * fVar29;
          auVar47._28_4_ = auVar99._28_4_;
          auVar118._0_4_ = auVar79._0_4_ + local_1420._0_4_;
          auVar118._4_4_ = auVar79._4_4_ + local_1420._4_4_;
          auVar118._8_4_ = auVar79._8_4_ + local_1420._8_4_;
          auVar118._12_4_ = auVar79._12_4_ + local_1420._12_4_;
          auVar118._16_4_ = auVar79._16_4_ + local_1420._16_4_;
          auVar118._20_4_ = auVar79._20_4_ + local_1420._20_4_;
          auVar118._24_4_ = auVar79._24_4_ + local_1420._24_4_;
          auVar118._28_4_ = auVar79._28_4_ + local_1420._28_4_;
          auVar34 = vfmsub231ps_fma(auVar47,local_1520,auVar118);
          fVar107 = local_14e0._0_4_;
          fVar110 = local_14e0._4_4_;
          auVar48._4_4_ = auVar118._4_4_ * fVar110;
          auVar48._0_4_ = auVar118._0_4_ * fVar107;
          fVar18 = local_14e0._8_4_;
          auVar48._8_4_ = auVar118._8_4_ * fVar18;
          fVar21 = local_14e0._12_4_;
          auVar48._12_4_ = auVar118._12_4_ * fVar21;
          fVar24 = local_14e0._16_4_;
          auVar48._16_4_ = auVar118._16_4_ * fVar24;
          fVar27 = local_14e0._20_4_;
          auVar48._20_4_ = auVar118._20_4_ * fVar27;
          fVar30 = local_14e0._24_4_;
          auVar48._24_4_ = auVar118._24_4_ * fVar30;
          auVar48._28_4_ = auVar118._28_4_;
          auVar35 = vfmsub231ps_fma(auVar48,local_1500,auVar95);
          auVar49._4_4_ = auVar35._4_4_ * fStack_165c;
          auVar49._0_4_ = auVar35._0_4_ * fStack_165c;
          auVar49._8_4_ = auVar35._8_4_ * fStack_165c;
          auVar49._12_4_ = auVar35._12_4_ * fStack_165c;
          auVar49._16_4_ = fStack_165c * 0.0;
          auVar49._20_4_ = fStack_165c * 0.0;
          auVar49._24_4_ = fStack_165c * 0.0;
          auVar49._28_4_ = local_1520._28_4_;
          auVar34 = vfmadd231ps_fma(auVar49,local_1820,ZEXT1632(auVar34));
          auVar34 = vfmadd231ps_fma(ZEXT1632(auVar34),local_1840,ZEXT1632(auVar86));
          auVar33 = vsubps_avx(auVar79,auVar40);
          auVar89._0_4_ = auVar79._0_4_ + auVar40._0_4_;
          auVar89._4_4_ = auVar79._4_4_ + auVar40._4_4_;
          auVar89._8_4_ = auVar79._8_4_ + auVar40._8_4_;
          auVar89._12_4_ = auVar79._12_4_ + auVar40._12_4_;
          auVar89._16_4_ = auVar79._16_4_ + auVar40._16_4_;
          auVar89._20_4_ = auVar79._20_4_ + auVar40._20_4_;
          auVar89._24_4_ = auVar79._24_4_ + auVar40._24_4_;
          auVar89._28_4_ = auVar79._28_4_ + auVar40._28_4_;
          auVar40 = vsubps_avx(auVar87,auVar31);
          auVar105._0_4_ = auVar87._0_4_ + auVar31._0_4_;
          auVar105._4_4_ = auVar87._4_4_ + auVar31._4_4_;
          auVar105._8_4_ = auVar87._8_4_ + auVar31._8_4_;
          auVar105._12_4_ = auVar87._12_4_ + auVar31._12_4_;
          auVar105._16_4_ = auVar87._16_4_ + auVar31._16_4_;
          auVar105._20_4_ = auVar87._20_4_ + auVar31._20_4_;
          auVar105._24_4_ = auVar87._24_4_ + auVar31._24_4_;
          auVar105._28_4_ = auVar87._28_4_ + auVar31._28_4_;
          auVar31 = vsubps_avx(auVar85,auVar32);
          auVar82._0_4_ = auVar85._0_4_ + auVar32._0_4_;
          auVar82._4_4_ = auVar85._4_4_ + auVar32._4_4_;
          auVar82._8_4_ = auVar85._8_4_ + auVar32._8_4_;
          auVar82._12_4_ = auVar85._12_4_ + auVar32._12_4_;
          auVar82._16_4_ = auVar85._16_4_ + auVar32._16_4_;
          auVar82._20_4_ = auVar85._20_4_ + auVar32._20_4_;
          auVar82._24_4_ = auVar85._24_4_ + auVar32._24_4_;
          auVar82._28_4_ = auVar85._28_4_ + auVar32._28_4_;
          auVar112._0_4_ = auVar31._0_4_ * auVar105._0_4_;
          auVar112._4_4_ = auVar31._4_4_ * auVar105._4_4_;
          auVar112._8_4_ = auVar31._8_4_ * auVar105._8_4_;
          auVar112._12_4_ = auVar31._12_4_ * auVar105._12_4_;
          auVar112._16_4_ = auVar31._16_4_ * auVar105._16_4_;
          auVar112._20_4_ = auVar31._20_4_ * auVar105._20_4_;
          auVar112._24_4_ = auVar31._24_4_ * auVar105._24_4_;
          auVar112._28_4_ = 0;
          auVar35 = vfmsub231ps_fma(auVar112,auVar40,auVar82);
          auVar50._4_4_ = auVar82._4_4_ * auVar33._4_4_;
          auVar50._0_4_ = auVar82._0_4_ * auVar33._0_4_;
          auVar50._8_4_ = auVar82._8_4_ * auVar33._8_4_;
          auVar50._12_4_ = auVar82._12_4_ * auVar33._12_4_;
          auVar50._16_4_ = auVar82._16_4_ * auVar33._16_4_;
          auVar50._20_4_ = auVar82._20_4_ * auVar33._20_4_;
          auVar50._24_4_ = auVar82._24_4_ * auVar33._24_4_;
          auVar50._28_4_ = auVar82._28_4_;
          auVar86 = vfmsub231ps_fma(auVar50,auVar31,auVar89);
          auVar51._4_4_ = auVar89._4_4_ * auVar40._4_4_;
          auVar51._0_4_ = auVar89._0_4_ * auVar40._0_4_;
          auVar51._8_4_ = auVar89._8_4_ * auVar40._8_4_;
          auVar51._12_4_ = auVar89._12_4_ * auVar40._12_4_;
          auVar51._16_4_ = auVar89._16_4_ * auVar40._16_4_;
          auVar51._20_4_ = auVar89._20_4_ * auVar40._20_4_;
          auVar51._24_4_ = auVar89._24_4_ * auVar40._24_4_;
          auVar51._28_4_ = auVar89._28_4_;
          auVar36 = vfmsub231ps_fma(auVar51,auVar33,auVar105);
          local_1660 = fStack_165c;
          fStack_1658 = fStack_165c;
          fStack_1654 = fStack_165c;
          fStack_1650 = fStack_165c;
          fStack_164c = fStack_165c;
          fStack_1648 = fStack_165c;
          fStack_1644 = fStack_165c;
          auVar90._0_4_ = fStack_165c * auVar36._0_4_;
          auVar90._4_4_ = fStack_165c * auVar36._4_4_;
          auVar90._8_4_ = fStack_165c * auVar36._8_4_;
          auVar90._12_4_ = fStack_165c * auVar36._12_4_;
          auVar90._16_4_ = fStack_165c * 0.0;
          auVar90._20_4_ = fStack_165c * 0.0;
          auVar90._24_4_ = fStack_165c * 0.0;
          auVar90._28_4_ = 0;
          auVar86 = vfmadd231ps_fma(auVar90,local_1820,ZEXT1632(auVar86));
          auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),local_1840,ZEXT1632(auVar35));
          local_13c0 = auVar78._0_4_;
          fStack_13bc = auVar78._4_4_;
          fStack_13b8 = auVar78._8_4_;
          fStack_13b4 = auVar78._12_4_;
          local_1380 = ZEXT1632(CONCAT412(auVar86._12_4_ + fStack_13b4 + auVar34._12_4_,
                                          CONCAT48(auVar86._8_4_ + fStack_13b8 + auVar34._8_4_,
                                                   CONCAT44(auVar86._4_4_ +
                                                            fStack_13bc + auVar34._4_4_,
                                                            auVar86._0_4_ +
                                                            local_13c0 + auVar34._0_4_))));
          auVar83._8_4_ = 0x7fffffff;
          auVar83._0_8_ = 0x7fffffff7fffffff;
          auVar83._12_4_ = 0x7fffffff;
          auVar83._16_4_ = 0x7fffffff;
          auVar83._20_4_ = 0x7fffffff;
          auVar83._24_4_ = 0x7fffffff;
          auVar83._28_4_ = 0x7fffffff;
          local_1540 = ZEXT1632(auVar78);
          auVar79 = vminps_avx(local_1540,ZEXT1632(auVar34));
          auVar79 = vminps_avx(auVar79,ZEXT1632(auVar86));
          local_1560 = vandps_avx(local_1380,auVar83);
          fVar116 = local_1560._0_4_ * 1.1920929e-07;
          fVar121 = local_1560._4_4_ * 1.1920929e-07;
          auVar52._4_4_ = fVar121;
          auVar52._0_4_ = fVar116;
          fVar122 = local_1560._8_4_ * 1.1920929e-07;
          auVar52._8_4_ = fVar122;
          fVar123 = local_1560._12_4_ * 1.1920929e-07;
          auVar52._12_4_ = fVar123;
          fVar124 = local_1560._16_4_ * 1.1920929e-07;
          auVar52._16_4_ = fVar124;
          fVar125 = local_1560._20_4_ * 1.1920929e-07;
          auVar52._20_4_ = fVar125;
          fVar126 = local_1560._24_4_ * 1.1920929e-07;
          auVar52._24_4_ = fVar126;
          auVar52._28_4_ = 0x34000000;
          auVar113._0_8_ = CONCAT44(fVar121,fVar116) ^ 0x8000000080000000;
          auVar113._8_4_ = -fVar122;
          auVar113._12_4_ = -fVar123;
          auVar113._16_4_ = -fVar124;
          auVar113._20_4_ = -fVar125;
          auVar113._24_4_ = -fVar126;
          auVar113._28_4_ = 0xb4000000;
          auVar79 = vcmpps_avx(auVar79,auVar113,5);
          auVar85 = vmaxps_avx(local_1540,ZEXT1632(auVar34));
          auVar87 = vmaxps_avx(auVar85,ZEXT1632(auVar86));
          auVar87 = vcmpps_avx(auVar87,auVar52,2);
          auVar87 = vorps_avx(auVar79,auVar87);
          fVar126 = fStack_171c;
          fVar133 = fStack_1718;
          fVar134 = fStack_1714;
          fVar135 = fStack_1710;
          fVar136 = fStack_170c;
          fVar137 = fStack_1708;
          fVar123 = local_1720;
          fVar139 = fStack_173c;
          fVar140 = fStack_1738;
          fVar141 = fStack_1734;
          fVar142 = fStack_1730;
          fVar143 = fStack_172c;
          fVar144 = fStack_1728;
          fVar124 = local_1740;
          fVar145 = fStack_175c;
          fVar146 = fStack_1758;
          fVar147 = fStack_1754;
          fVar148 = fStack_1750;
          fVar149 = fStack_174c;
          fVar150 = fStack_1748;
          fVar125 = local_1760;
          fVar152 = fStack_177c;
          fVar153 = fStack_1778;
          fVar154 = fStack_1774;
          fVar155 = fStack_1770;
          fVar156 = fStack_176c;
          fVar157 = fStack_1768;
          fVar116 = local_1780;
          fVar158 = fStack_179c;
          fVar159 = fStack_1798;
          fVar160 = fStack_1794;
          fVar161 = fStack_1790;
          fVar162 = fStack_178c;
          fVar163 = fStack_1788;
          fVar121 = local_17a0;
          fVar164 = fStack_17bc;
          fVar165 = fStack_17b8;
          fVar166 = fStack_17b4;
          fVar167 = fStack_17b0;
          fVar168 = fStack_17ac;
          fVar169 = fStack_17a8;
          fVar122 = local_17c0;
          if ((((((((auVar87 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar87 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar87 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar87 >> 0x7f,0) == '\0') &&
                (auVar87 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar87 >> 0xbf,0) == '\0') &&
              (auVar87 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar87[0x1f]) {
LAB_0066d401:
            auVar115 = ZEXT3264(local_16c0);
            auVar120 = ZEXT3264(local_16e0);
            auVar131 = ZEXT3264(local_1700);
            auVar96 = ZEXT3264(local_1680);
            auVar101 = ZEXT3264(local_16a0);
          }
          else {
            auVar53._4_4_ = local_14a0._4_4_ * fVar110;
            auVar53._0_4_ = local_14a0._0_4_ * fVar107;
            auVar53._8_4_ = local_14a0._8_4_ * fVar18;
            auVar53._12_4_ = local_14a0._12_4_ * fVar21;
            auVar53._16_4_ = local_14a0._16_4_ * fVar24;
            auVar53._20_4_ = local_14a0._20_4_ * fVar27;
            auVar53._24_4_ = local_14a0._24_4_ * fVar30;
            auVar53._28_4_ = auVar79._28_4_;
            auVar54._4_4_ = fVar109 * local_14c0._4_4_;
            auVar54._0_4_ = fVar106 * local_14c0._0_4_;
            auVar54._8_4_ = fVar17 * local_14c0._8_4_;
            auVar54._12_4_ = fVar20 * local_14c0._12_4_;
            auVar54._16_4_ = fVar23 * local_14c0._16_4_;
            auVar54._20_4_ = fVar26 * local_14c0._20_4_;
            auVar54._24_4_ = fVar29 * local_14c0._24_4_;
            auVar54._28_4_ = 0x34000000;
            auVar78 = vfmsub213ps_fma(local_14c0,local_1520,auVar53);
            auVar55._4_4_ = fVar108 * auVar40._4_4_;
            auVar55._0_4_ = fVar102 * auVar40._0_4_;
            auVar55._8_4_ = fVar111 * auVar40._8_4_;
            auVar55._12_4_ = fVar19 * auVar40._12_4_;
            auVar55._16_4_ = fVar22 * auVar40._16_4_;
            auVar55._20_4_ = fVar25 * auVar40._20_4_;
            auVar55._24_4_ = fVar28 * auVar40._24_4_;
            auVar55._28_4_ = auVar85._28_4_;
            auVar129._0_4_ = fVar106 * auVar31._0_4_;
            auVar129._4_4_ = fVar109 * auVar31._4_4_;
            auVar129._8_4_ = fVar17 * auVar31._8_4_;
            auVar129._12_4_ = fVar20 * auVar31._12_4_;
            auVar129._16_4_ = fVar23 * auVar31._16_4_;
            auVar129._20_4_ = fVar26 * auVar31._20_4_;
            auVar129._24_4_ = fVar29 * auVar31._24_4_;
            auVar129._28_4_ = 0;
            auVar86 = vfmsub213ps_fma(auVar31,local_14e0,auVar55);
            auVar79 = vandps_avx(auVar53,auVar83);
            auVar85 = vandps_avx(auVar55,auVar83);
            auVar79 = vcmpps_avx(auVar79,auVar85,1);
            local_1360 = vblendvps_avx(ZEXT1632(auVar86),ZEXT1632(auVar78),auVar79);
            auVar56._4_4_ = auVar33._4_4_ * fVar110;
            auVar56._0_4_ = auVar33._0_4_ * fVar107;
            auVar56._8_4_ = auVar33._8_4_ * fVar18;
            auVar56._12_4_ = auVar33._12_4_ * fVar21;
            auVar56._16_4_ = auVar33._16_4_ * fVar24;
            auVar56._20_4_ = auVar33._20_4_ * fVar27;
            auVar56._24_4_ = auVar33._24_4_ * fVar30;
            auVar56._28_4_ = auVar79._28_4_;
            auVar78 = vfmsub213ps_fma(auVar33,local_1520,auVar129);
            auVar57._4_4_ = local_1480._4_4_ * fVar108;
            auVar57._0_4_ = local_1480._0_4_ * fVar102;
            auVar57._8_4_ = local_1480._8_4_ * fVar111;
            auVar57._12_4_ = local_1480._12_4_ * fVar19;
            auVar57._16_4_ = local_1480._16_4_ * fVar22;
            auVar57._20_4_ = local_1480._20_4_ * fVar25;
            auVar57._24_4_ = local_1480._24_4_ * fVar28;
            auVar57._28_4_ = auVar85._28_4_;
            auVar86 = vfmsub213ps_fma(local_14a0,local_1500,auVar57);
            auVar79 = vandps_avx(auVar57,auVar83);
            auVar85 = vandps_avx(auVar129,auVar83);
            auVar79 = vcmpps_avx(auVar79,auVar85,1);
            local_1340 = vblendvps_avx(ZEXT1632(auVar78),ZEXT1632(auVar86),auVar79);
            auVar78 = vfmsub213ps_fma(local_1480,local_14e0,auVar54);
            auVar86 = vfmsub213ps_fma(auVar40,local_1500,auVar56);
            auVar79 = vandps_avx(auVar54,auVar83);
            auVar85 = vandps_avx(auVar56,auVar83);
            auVar79 = vcmpps_avx(auVar79,auVar85,1);
            local_1320 = vblendvps_avx(ZEXT1632(auVar86),ZEXT1632(auVar78),auVar79);
            auVar78 = vpackssdw_avx(auVar87._0_16_,auVar87._16_16_);
            fVar102 = local_1320._0_4_;
            auVar84._0_4_ = fVar102 * fStack_165c;
            fVar106 = local_1320._4_4_;
            auVar84._4_4_ = fVar106 * fStack_165c;
            fVar107 = local_1320._8_4_;
            auVar84._8_4_ = fVar107 * fStack_165c;
            fVar108 = local_1320._12_4_;
            auVar84._12_4_ = fVar108 * fStack_165c;
            fVar109 = local_1320._16_4_;
            auVar84._16_4_ = fVar109 * fStack_165c;
            fVar110 = local_1320._20_4_;
            auVar84._20_4_ = fVar110 * fStack_165c;
            fVar111 = local_1320._24_4_;
            auVar84._24_4_ = fVar111 * fStack_165c;
            auVar84._28_4_ = 0;
            auVar86 = vfmadd213ps_fma(local_1820,local_1340,auVar84);
            auVar86 = vfmadd213ps_fma(local_1840,local_1360,ZEXT1632(auVar86));
            auVar85 = ZEXT1632(CONCAT412(auVar86._12_4_ + auVar86._12_4_,
                                         CONCAT48(auVar86._8_4_ + auVar86._8_4_,
                                                  CONCAT44(auVar86._4_4_ + auVar86._4_4_,
                                                           auVar86._0_4_ + auVar86._0_4_))));
            auVar58._4_4_ = fVar106 * fVar11;
            auVar58._0_4_ = fVar102 * fVar10;
            auVar58._8_4_ = fVar107 * fVar12;
            auVar58._12_4_ = fVar108 * fVar13;
            auVar58._16_4_ = fVar109 * fVar14;
            auVar58._20_4_ = fVar110 * fVar15;
            auVar58._24_4_ = fVar111 * fVar16;
            auVar58._28_4_ = auVar87._28_4_;
            auVar86 = vfmadd213ps_fma(local_1440,local_1340,auVar58);
            auVar35 = vfmadd213ps_fma(local_1420,local_1360,ZEXT1632(auVar86));
            auVar79 = vrcpps_avx(auVar85);
            auVar132._8_4_ = 0x3f800000;
            auVar132._0_8_ = &DAT_3f8000003f800000;
            auVar132._12_4_ = 0x3f800000;
            auVar132._16_4_ = 0x3f800000;
            auVar132._20_4_ = 0x3f800000;
            auVar132._24_4_ = 0x3f800000;
            auVar132._28_4_ = 0x3f800000;
            auVar86 = vfnmadd213ps_fma(auVar79,auVar85,auVar132);
            auVar86 = vfmadd132ps_fma(ZEXT1632(auVar86),auVar79,auVar79);
            local_12a0 = ZEXT1632(CONCAT412(auVar86._12_4_ * (auVar35._12_4_ + auVar35._12_4_),
                                            CONCAT48(auVar86._8_4_ * (auVar35._8_4_ + auVar35._8_4_)
                                                     ,CONCAT44(auVar86._4_4_ *
                                                               (auVar35._4_4_ + auVar35._4_4_),
                                                               auVar86._0_4_ *
                                                               (auVar35._0_4_ + auVar35._0_4_)))));
            uVar74 = *(undefined4 *)(ray + k * 4 + 0x30);
            auVar119._4_4_ = uVar74;
            auVar119._0_4_ = uVar74;
            auVar119._8_4_ = uVar74;
            auVar119._12_4_ = uVar74;
            auVar119._16_4_ = uVar74;
            auVar119._20_4_ = uVar74;
            auVar119._24_4_ = uVar74;
            auVar119._28_4_ = uVar74;
            uVar74 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar130._4_4_ = uVar74;
            auVar130._0_4_ = uVar74;
            auVar130._8_4_ = uVar74;
            auVar130._12_4_ = uVar74;
            auVar130._16_4_ = uVar74;
            auVar130._20_4_ = uVar74;
            auVar130._24_4_ = uVar74;
            auVar130._28_4_ = uVar74;
            auVar79 = vcmpps_avx(auVar119,local_12a0,2);
            auVar87 = vcmpps_avx(local_12a0,auVar130,2);
            auVar79 = vandps_avx(auVar79,auVar87);
            auVar86 = vpackssdw_avx(auVar79._0_16_,auVar79._16_16_);
            auVar78 = vpand_avx(auVar86,auVar78);
            auVar79 = vpmovsxwd_avx2(auVar78);
            if ((((((((auVar79 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar79 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar79 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar79 >> 0x7f,0) == '\0') &&
                  (auVar79 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar79 >> 0xbf,0) == '\0') &&
                (auVar79 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar79[0x1f]) goto LAB_0066d401;
            auVar79 = vcmpps_avx(auVar85,_DAT_02020f00,4);
            auVar86 = vpackssdw_avx(auVar79._0_16_,auVar79._16_16_);
            auVar78 = vpand_avx(auVar78,auVar86);
            local_1300 = vpmovsxwd_avx2(auVar78);
            if ((((((((local_1300 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (local_1300 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (local_1300 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(local_1300 >> 0x7f,0) == '\0') &&
                  (local_1300 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(local_1300 >> 0xbf,0) == '\0') &&
                (local_1300 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < local_1300[0x1f]) goto LAB_0066d401;
            uStack_13b0 = 0;
            uStack_13ac = 0;
            uStack_13a8 = 0;
            uStack_13a4 = 0;
            local_13a0 = ZEXT1632(auVar34);
            local_1220 = local_1580;
            auVar79 = vrcpps_avx(local_1380);
            auVar100._8_4_ = 0x3f800000;
            auVar100._0_8_ = &DAT_3f8000003f800000;
            auVar100._12_4_ = 0x3f800000;
            auVar100._16_4_ = 0x3f800000;
            auVar100._20_4_ = 0x3f800000;
            auVar100._24_4_ = 0x3f800000;
            auVar100._28_4_ = 0x3f800000;
            auVar86 = vfnmadd213ps_fma(local_1380,auVar79,auVar100);
            auVar86 = vfmadd132ps_fma(ZEXT1632(auVar86),auVar79,auVar79);
            auVar91._8_4_ = 0x219392ef;
            auVar91._0_8_ = 0x219392ef219392ef;
            auVar91._12_4_ = 0x219392ef;
            auVar91._16_4_ = 0x219392ef;
            auVar91._20_4_ = 0x219392ef;
            auVar91._24_4_ = 0x219392ef;
            auVar91._28_4_ = 0x219392ef;
            auVar79 = vcmpps_avx(local_1560,auVar91,5);
            auVar79 = vandps_avx(auVar79,ZEXT1632(auVar86));
            auVar59._4_4_ = fStack_13bc * auVar79._4_4_;
            auVar59._0_4_ = local_13c0 * auVar79._0_4_;
            auVar59._8_4_ = fStack_13b8 * auVar79._8_4_;
            auVar59._12_4_ = fStack_13b4 * auVar79._12_4_;
            auVar59._16_4_ = auVar79._16_4_ * 0.0;
            auVar59._20_4_ = auVar79._20_4_ * 0.0;
            auVar59._24_4_ = auVar79._24_4_ * 0.0;
            auVar59._28_4_ = 0;
            auVar87 = vminps_avx(auVar59,auVar100);
            auVar60._4_4_ = auVar34._4_4_ * auVar79._4_4_;
            auVar60._0_4_ = auVar34._0_4_ * auVar79._0_4_;
            auVar60._8_4_ = auVar34._8_4_ * auVar79._8_4_;
            auVar60._12_4_ = auVar34._12_4_ * auVar79._12_4_;
            auVar60._16_4_ = auVar79._16_4_ * 0.0;
            auVar60._20_4_ = auVar79._20_4_ * 0.0;
            auVar60._24_4_ = auVar79._24_4_ * 0.0;
            auVar60._28_4_ = auVar79._28_4_;
            auVar79 = vminps_avx(auVar60,auVar100);
            auVar85 = vsubps_avx(auVar100,auVar87);
            auVar40 = vsubps_avx(auVar100,auVar79);
            local_12c0 = vblendvps_avx(auVar79,auVar85,local_1580);
            local_12e0 = vblendvps_avx(auVar87,auVar40,local_1580);
            local_1260._4_4_ = (float)local_15a0._4_4_ * local_1340._4_4_;
            local_1260._0_4_ = (float)local_15a0._0_4_ * local_1340._0_4_;
            local_1260._8_4_ = fStack_1598 * local_1340._8_4_;
            local_1260._12_4_ = fStack_1594 * local_1340._12_4_;
            local_1260._16_4_ = fStack_1590 * local_1340._16_4_;
            local_1260._20_4_ = fStack_158c * local_1340._20_4_;
            local_1260._24_4_ = fStack_1588 * local_1340._24_4_;
            local_1260._28_4_ = local_12c0._28_4_;
            local_1280[0] = local_1360._0_4_ * (float)local_15a0._0_4_;
            local_1280[1] = local_1360._4_4_ * (float)local_15a0._4_4_;
            local_1280[2] = local_1360._8_4_ * fStack_1598;
            local_1280[3] = local_1360._12_4_ * fStack_1594;
            fStack_1270 = local_1360._16_4_ * fStack_1590;
            fStack_126c = local_1360._20_4_ * fStack_158c;
            fStack_1268 = local_1360._24_4_ * fStack_1588;
            uStack_1264 = local_12e0._28_4_;
            local_1240[0] = (float)local_15a0._0_4_ * fVar102;
            local_1240[1] = (float)local_15a0._4_4_ * fVar106;
            local_1240[2] = fStack_1598 * fVar107;
            local_1240[3] = fStack_1594 * fVar108;
            fStack_1230 = fStack_1590 * fVar109;
            fStack_122c = fStack_158c * fVar110;
            fStack_1228 = fStack_1588 * fVar111;
            uStack_1224 = uStack_1584;
            auVar78 = vpacksswb_avx(auVar78,auVar78);
            uVar70 = (ulong)(byte)(SUB161(auVar78 >> 7,0) & 1 | (SUB161(auVar78 >> 0xf,0) & 1) << 1
                                   | (SUB161(auVar78 >> 0x17,0) & 1) << 2 |
                                   (SUB161(auVar78 >> 0x1f,0) & 1) << 3 |
                                   (SUB161(auVar78 >> 0x27,0) & 1) << 4 |
                                   (SUB161(auVar78 >> 0x2f,0) & 1) << 5 |
                                   (SUB161(auVar78 >> 0x37,0) & 1) << 6 |
                                  SUB161(auVar78 >> 0x3f,0) << 7);
            auVar115 = ZEXT3264(local_16c0);
            auVar120 = ZEXT3264(local_16e0);
            auVar131 = ZEXT3264(local_1700);
            auVar96 = ZEXT3264(local_1680);
            auVar101 = ZEXT3264(local_16a0);
            do {
              uVar66 = 0;
              for (uVar69 = uVar70; (uVar69 & 1) == 0; uVar69 = uVar69 >> 1 | 0x8000000000000000) {
                uVar66 = uVar66 + 1;
              }
              uVar65 = *(uint *)((long)&local_13e0 + uVar66 * 4);
              pGVar8 = (pSVar2->geometries).items[uVar65].ptr;
              if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                uVar70 = uVar70 ^ 1L << (uVar66 & 0x3f);
                bVar77 = true;
              }
              else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                      (pGVar8->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                bVar77 = false;
              }
              else {
                local_1820._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                uVar69 = (ulong)(uint)((int)uVar66 * 4);
                uVar74 = *(undefined4 *)(local_12e0 + uVar69);
                local_1600._4_4_ = uVar74;
                local_1600._0_4_ = uVar74;
                local_1600._8_4_ = uVar74;
                local_1600._12_4_ = uVar74;
                uVar74 = *(undefined4 *)(local_12c0 + uVar69);
                local_15f0._4_4_ = uVar74;
                local_15f0._0_4_ = uVar74;
                local_15f0._8_4_ = uVar74;
                local_15f0._12_4_ = uVar74;
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_12a0 + uVar69);
                local_17f0.context = context->user;
                local_15d0._4_4_ = uVar65;
                local_15d0._0_4_ = uVar65;
                local_15d0._8_4_ = uVar65;
                local_15d0._12_4_ = uVar65;
                local_15e0 = *(undefined4 *)((long)&local_1400 + uVar69);
                local_1630 = *(undefined4 *)((long)local_1280 + uVar69);
                uVar74 = *(undefined4 *)(local_1260 + uVar69);
                local_1620._4_4_ = uVar74;
                local_1620._0_4_ = uVar74;
                local_1620._8_4_ = uVar74;
                local_1620._12_4_ = uVar74;
                uVar74 = *(undefined4 *)((long)local_1240 + uVar69);
                local_1610._4_4_ = uVar74;
                local_1610._0_4_ = uVar74;
                local_1610._8_4_ = uVar74;
                local_1610._12_4_ = uVar74;
                vpcmpeqd_avx2(ZEXT1632(local_15d0),ZEXT1632(local_15d0));
                uStack_15bc = (local_17f0.context)->instID[0];
                local_15c0 = uStack_15bc;
                uStack_15b8 = uStack_15bc;
                uStack_15b4 = uStack_15bc;
                uStack_15b0 = (local_17f0.context)->instPrimID[0];
                uStack_15ac = uStack_15b0;
                uStack_15a8 = uStack_15b0;
                uStack_15a4 = uStack_15b0;
                local_1870 = *local_1860;
                uStack_1868 = local_1860[1];
                local_17f0.valid = (int *)&local_1870;
                local_17f0.geometryUserPtr = pGVar8->userPtr;
                local_17f0.hit = (RTCHitN *)&local_1630;
                local_17f0.N = 4;
                local_17f0.ray = (RTCRayN *)ray;
                uStack_162c = local_1630;
                uStack_1628 = local_1630;
                uStack_1624 = local_1630;
                uStack_15dc = local_15e0;
                uStack_15d8 = local_15e0;
                uStack_15d4 = local_15e0;
                if (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                  local_1840._0_8_ = ray;
                  (*pGVar8->occlusionFilterN)(&local_17f0);
                  auVar131 = ZEXT3264(local_1700);
                  auVar120 = ZEXT3264(local_16e0);
                  auVar115 = ZEXT3264(local_16c0);
                  ray = (RayK<4> *)local_1840._0_8_;
                  fVar123 = local_1720;
                  fVar126 = fStack_171c;
                  fVar133 = fStack_1718;
                  fVar134 = fStack_1714;
                  fVar135 = fStack_1710;
                  fVar136 = fStack_170c;
                  fVar137 = fStack_1708;
                  fVar124 = local_1740;
                  fVar139 = fStack_173c;
                  fVar140 = fStack_1738;
                  fVar141 = fStack_1734;
                  fVar142 = fStack_1730;
                  fVar143 = fStack_172c;
                  fVar144 = fStack_1728;
                  fVar125 = local_1760;
                  fVar145 = fStack_175c;
                  fVar146 = fStack_1758;
                  fVar147 = fStack_1754;
                  fVar148 = fStack_1750;
                  fVar149 = fStack_174c;
                  fVar150 = fStack_1748;
                  fVar116 = local_1780;
                  fVar152 = fStack_177c;
                  fVar153 = fStack_1778;
                  fVar154 = fStack_1774;
                  fVar155 = fStack_1770;
                  fVar156 = fStack_176c;
                  fVar157 = fStack_1768;
                  fVar121 = local_17a0;
                  fVar158 = fStack_179c;
                  fVar159 = fStack_1798;
                  fVar160 = fStack_1794;
                  fVar161 = fStack_1790;
                  fVar162 = fStack_178c;
                  fVar163 = fStack_1788;
                  fVar122 = local_17c0;
                  fVar164 = fStack_17bc;
                  fVar165 = fStack_17b8;
                  fVar166 = fStack_17b4;
                  fVar167 = fStack_17b0;
                  fVar168 = fStack_17ac;
                  fVar169 = fStack_17a8;
                }
                auVar78._8_8_ = uStack_1868;
                auVar78._0_8_ = local_1870;
                auVar96 = ZEXT3264(local_1680);
                auVar101 = ZEXT3264(local_16a0);
                if (auVar78 == (undefined1  [16])0x0) {
                  auVar78 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                  auVar78 = auVar78 ^ _DAT_01febe20;
                }
                else {
                  p_Var9 = context->args->filter;
                  if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar8->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    (*p_Var9)(&local_17f0);
                    auVar101 = ZEXT3264(local_16a0);
                    auVar96 = ZEXT3264(local_1680);
                    auVar131 = ZEXT3264(local_1700);
                    auVar120 = ZEXT3264(local_16e0);
                    auVar115 = ZEXT3264(local_16c0);
                    fVar123 = local_1720;
                    fVar126 = fStack_171c;
                    fVar133 = fStack_1718;
                    fVar134 = fStack_1714;
                    fVar135 = fStack_1710;
                    fVar136 = fStack_170c;
                    fVar137 = fStack_1708;
                    fVar124 = local_1740;
                    fVar139 = fStack_173c;
                    fVar140 = fStack_1738;
                    fVar141 = fStack_1734;
                    fVar142 = fStack_1730;
                    fVar143 = fStack_172c;
                    fVar144 = fStack_1728;
                    fVar125 = local_1760;
                    fVar145 = fStack_175c;
                    fVar146 = fStack_1758;
                    fVar147 = fStack_1754;
                    fVar148 = fStack_1750;
                    fVar149 = fStack_174c;
                    fVar150 = fStack_1748;
                    fVar116 = local_1780;
                    fVar152 = fStack_177c;
                    fVar153 = fStack_1778;
                    fVar154 = fStack_1774;
                    fVar155 = fStack_1770;
                    fVar156 = fStack_176c;
                    fVar157 = fStack_1768;
                    fVar121 = local_17a0;
                    fVar158 = fStack_179c;
                    fVar159 = fStack_1798;
                    fVar160 = fStack_1794;
                    fVar161 = fStack_1790;
                    fVar162 = fStack_178c;
                    fVar163 = fStack_1788;
                    fVar122 = local_17c0;
                    fVar164 = fStack_17bc;
                    fVar165 = fStack_17b8;
                    fVar166 = fStack_17b4;
                    fVar167 = fStack_17b0;
                    fVar168 = fStack_17ac;
                    fVar169 = fStack_17a8;
                  }
                  auVar34._8_8_ = uStack_1868;
                  auVar34._0_8_ = local_1870;
                  auVar34 = vpcmpeqd_avx((undefined1  [16])0x0,auVar34);
                  auVar78 = auVar34 ^ _DAT_01febe20;
                  auVar86._8_4_ = 0xff800000;
                  auVar86._0_8_ = 0xff800000ff800000;
                  auVar86._12_4_ = 0xff800000;
                  auVar34 = vblendvps_avx(auVar86,*(undefined1 (*) [16])(local_17f0.ray + 0x80),
                                          auVar34);
                  *(undefined1 (*) [16])(local_17f0.ray + 0x80) = auVar34;
                }
                auVar78 = vpslld_avx(auVar78,0x1f);
                bVar63 = (auVar78 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
                bVar64 = (auVar78 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
                bVar62 = (auVar78 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
                bVar61 = -1 < auVar78[0xf];
                bVar77 = ((bVar63 && bVar64) && bVar62) && bVar61;
                if (((bVar63 && bVar64) && bVar62) && bVar61) {
                  *(undefined4 *)(ray + k * 4 + 0x80) = local_1820._0_4_;
                  uVar70 = uVar70 ^ 1L << (uVar66 & 0x3f);
                }
              }
              if (!bVar77) {
                uVar65 = 0;
                if (bVar76) {
                  *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                  uVar65 = 1;
                }
                goto LAB_0066d49d;
              }
            } while (uVar70 != 0);
          }
          uVar65 = 0;
          local_1850 = local_1850 + 1;
          bVar76 = local_1850 < local_1858;
        } while (local_1850 != local_1858);
      }
    }
LAB_0066d49d:
  } while ((uVar65 & 3) == 0);
  return local_1848 != &local_1200;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }